

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O0

void VSU_Write(void *info,UINT16 A,UINT8 V)

{
  ushort uVar1;
  uint uVar2;
  undefined4 uVar3;
  int local_28;
  int i;
  int ch;
  vsu_state *chip;
  UINT8 V_local;
  UINT16 A_local;
  void *info_local;
  
  uVar1 = (A & 0x1ff) << 2;
  if (uVar1 < 0x280) {
    *(byte *)((long)info +
             (long)(int)((int)(uint)uVar1 >> 2 & 0x1f) + (long)((int)(uint)uVar1 >> 7) * 0x20 + 0x39
             ) = V & 0x3f;
  }
  else if (uVar1 < 0x400) {
    *(UINT8 *)((long)info + (long)(int)((int)(uint)uVar1 >> 2 & 0x1f) + 0xd9) = V;
  }
  else if (uVar1 < 0x600) {
    uVar2 = (int)(uint)uVar1 >> 6 & 0xf;
    if (uVar2 < 6) {
      switch(A & 0xf) {
      case 0:
        *(byte *)((long)info + (long)(int)uVar2 + 8) = V & 0xbf;
        if ((V & 0x80) != 0) {
          *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) =
               (uint)*(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a);
          if (uVar2 == 5) {
            *(int *)((long)info + 0x160) = (0x800 - *(int *)((long)info + 0x110)) * 10;
          }
          else {
            *(int *)((long)info + (long)(int)uVar2 * 4 + 0x14c) =
                 0x800 - *(int *)((long)info + (long)(int)uVar2 * 4 + 0xfc);
          }
          *(uint *)((long)info + (long)(int)uVar2 * 4 + 0x164) = (V & 0x1f) + 1;
          *(uint *)((long)info + (long)(int)uVar2 * 4 + 0x17c) =
               (*(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) & 7) + 1;
          if (uVar2 == 4) {
            *(uint *)((long)info + 0x194) = (int)(uint)*(byte *)((long)info + 0x38) >> 4 & 7;
            uVar3 = 1;
            if ((*(byte *)((long)info + 0x38) & 0x80) != 0) {
              uVar3 = 8;
            }
            *(undefined4 *)((long)info + 0x1e0) = uVar3;
            *(undefined1 *)((long)info + 0x132) = 0;
          }
          *(undefined1 *)((long)info + (long)(int)uVar2 + 300) = 0;
          if (uVar2 == 5) {
            *(undefined4 *)((long)info + 0x1ec) = 1;
          }
          *(undefined4 *)((long)info + (long)(int)uVar2 * 4 + 0x198) = 0x12c0;
          *(undefined4 *)((long)info + (long)(int)uVar2 * 4 + 0x1b0) = 4;
          *(undefined4 *)((long)info + (long)(int)uVar2 * 4 + 0x1c8) = 4;
        }
        break;
      case 1:
        *(char *)((long)info + (long)(int)uVar2 + 0xe) = (char)((int)(uint)V >> 4);
        *(byte *)((long)info + (long)(int)uVar2 + 0x14) = V & 0xf;
        break;
      case 2:
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) & 0xff00;
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) | (ushort)V;
        *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) =
             *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) & 0xff00;
        *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) =
             (uint)V | *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc);
        break;
      case 3:
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) & 0xff;
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x1a) | (V & 7) << 8;
        *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) =
             *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) & 0xff;
        *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc) =
             (V & 7) << 8 | *(uint *)((long)info + (long)(int)uVar2 * 4 + 0xfc);
        break;
      case 4:
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) & 0xff00;
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) | (ushort)V;
        *(int *)((long)info + (long)(int)uVar2 * 4 + 0x114) = (int)(uint)V >> 4;
        break;
      case 5:
        *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) =
             *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) & 0xff;
        if (uVar2 == 4) {
          *(ushort *)((long)info + 0x2e) = *(ushort *)((long)info + 0x2e) | (V & 0x73) << 8;
        }
        else if (uVar2 == 5) {
          *(ushort *)((long)info + 0x30) = *(ushort *)((long)info + 0x30) | (V & 0x73) << 8;
        }
        else {
          *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) =
               *(ushort *)((long)info + (long)(int)uVar2 * 2 + 0x26) | (V & 3) << 8;
        }
        break;
      case 6:
        *(byte *)((long)info + (long)(int)uVar2 + 0x32) = V & 0xf;
        break;
      case 7:
        if (uVar2 == 4) {
          *(UINT8 *)((long)info + 0x38) = V;
        }
      }
    }
    else if (((A & 0x1ff) == 0x160) && ((V & 1) != 0)) {
      for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
        *(byte *)((long)info + (long)local_28 + 8) =
             *(byte *)((long)info + (long)local_28 + 8) & 0x7f;
      }
    }
  }
  return;
}

Assistant:

static void VSU_Write(void* info, UINT16 A, UINT8 V)
{
	vsu_state* chip = (vsu_state*)info;
	
	A <<= 2;
	A &= 0x7FF;

	//printf("VSU Write: %d, %08x %02x\n", timestamp, A, V);

	if(A < 0x280)
		chip->WaveData[A >> 7][(A >> 2) & 0x1F] = V & 0x3F;
	else if(A < 0x400)
	{
		//if(A >= 0x300)
		// printf("Modulation mirror write? %08x %02x\n", A, V);
		chip->ModData[(A >> 2) & 0x1F] = V;
	}
	else if(A < 0x600)
	{
		int ch = (A >> 6) & 0xF;

		//if(ch < 6)
		//printf("Ch: %d, Reg: %d, Value: %02x\n", ch, (A >> 2) & 0xF, V);

		if(ch > 5)
		{
			if(A == 0x580 && (V & 1))
			{
				int i;
				//puts("STOP, HAMMER TIME");
				for(i = 0; i < 6; i++)
					chip->IntlControl[i] &= ~0x80;
			}
		}
		else
			switch((A >> 2) & 0xF)
			{
			case 0x0:
				chip->IntlControl[ch] = V & ~0x40;

				if(V & 0x80)
				{
					chip->EffFreq[ch] = chip->Frequency[ch];
					if(ch == 5)
						chip->FreqCounter[ch] = 10 * (2048 - chip->EffFreq[ch]);
					else
						chip->FreqCounter[ch] = 2048 - chip->EffFreq[ch];
					chip->IntervalCounter[ch] = (V & 0x1F) + 1;
					chip->EnvelopeCounter[ch] = (chip->EnvControl[ch] & 0x7) + 1;

					if(ch == 4)
					{
						chip->SweepModCounter = (chip->SweepControl >> 4) & 7;
						chip->SweepModClockDivider = (chip->SweepControl & 0x80) ? 8 : 1;
						chip->ModWavePos = 0;
					}

					chip->WavePos[ch] = 0;

					if(ch == 5)
						chip->lfsr = 1;

					//if(!(chip->IntlControl[ch] & 0x80))
					// chip->Envelope[ch] = (chip->EnvControl[ch] >> 4) & 0xF;

					chip->EffectsClockDivider[ch] = 4800;
					chip->IntervalClockDivider[ch] = 4;
					chip->EnvelopeClockDivider[ch] = 4;
				}
				break;

			case 0x1:
				chip->LeftLevel[ch] = (V >> 4) & 0xF;
				chip->RightLevel[ch] = (V >> 0) & 0xF;
				break;

			case 0x2:
				chip->Frequency[ch] &= 0xFF00;
				chip->Frequency[ch] |= V << 0;
				chip->EffFreq[ch] &= 0xFF00;
				chip->EffFreq[ch] |= V << 0;
				break;

			case 0x3:
				chip->Frequency[ch] &= 0x00FF;
				chip->Frequency[ch] |= (V & 0x7) << 8;
				chip->EffFreq[ch] &= 0x00FF;
				chip->EffFreq[ch] |= (V & 0x7) << 8;
				break;

			case 0x4:
				chip->EnvControl[ch] &= 0xFF00;
				chip->EnvControl[ch] |= V << 0;

				chip->Envelope[ch] = (V >> 4) & 0xF;
				break;

			case 0x5:
				chip->EnvControl[ch] &= 0x00FF;
				if(ch == 4)
					chip->EnvControl[ch] |= (V & 0x73) << 8;
				else if(ch == 5)
					chip->EnvControl[ch] |= (V & 0x73) << 8;
				else
					chip->EnvControl[ch] |= (V & 0x03) << 8;
				break;

			case 0x6:
				chip->RAMAddress[ch] = V & 0xF;
				break;

			case 0x7:
				if(ch == 4)
				{
					chip->SweepControl = V;
				}
				break;
			}
	}
}